

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

bool __thiscall
cmQtAutoGenerators::GenerateMoc(cmQtAutoGenerators *this,string *sourceFile,string *mocFileName)

{
  bool bVar1;
  ostream *poVar2;
  pointer pbVar3;
  int retVal;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  int sourceNewerThanMoc;
  string output;
  string mocFilePath;
  string msg;
  string mocDir;
  
  std::operator+(&mocFilePath,&this->Builddir,mocFileName);
  sourceNewerThanMoc = 0;
  bVar1 = cmsys::SystemTools::FileTimeCompare(sourceFile,&mocFilePath,&sourceNewerThanMoc);
  if ((this->GenerateAll == false) && (bVar1 && sourceNewerThanMoc < 0)) {
    bVar1 = false;
  }
  else {
    std::__cxx11::string::rfind((char)&mocFilePath,0x2f);
    std::__cxx11::string::substr((ulong)&mocDir,(ulong)&mocFilePath);
    bVar1 = cmsys::SystemTools::FileExists(mocDir._M_dataplus._M_p,false);
    if (!bVar1) {
      cmsys::SystemTools::MakeDirectory(mocDir._M_dataplus._M_p);
    }
    std::__cxx11::string::string((string *)&msg,"Generating ",(allocator *)&output);
    std::__cxx11::string::append((string *)&msg);
    cmSystemTools::MakefileColorEcho(0x105,msg._M_dataplus._M_p,true,this->ColorOutput);
    command.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    command.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    command.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&command,&this->MocExecutable);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<std::_List_iterator<std::__cxx11::string>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&command,
               (const_iterator)
               command.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (this->MocIncludes).
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next,
               (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )&this->MocIncludes);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<std::_List_iterator<std::__cxx11::string>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&command,
               (const_iterator)
               command.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (this->MocDefinitions).
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next,
               (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )&this->MocDefinitions);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&command,
               (const_iterator)
               command.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (this->MocOptions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->MocOptions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::string((string *)&output,"-o",(allocator *)&retVal);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&command,&output
              );
    std::__cxx11::string::~string((string *)&output);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&command,&mocFilePath);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&command,sourceFile);
    pbVar3 = command.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (this->Verbose == true) {
      for (; pbVar3 != command.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
        poVar2 = std::operator<<((ostream *)&std::cout,(string *)pbVar3);
        std::operator<<(poVar2," ");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    retVal = 0;
    bVar1 = cmSystemTools::RunSingleCommand
                      (&command,&output,&output,&retVal,(char *)0x0,OUTPUT_MERGE,0.0);
    if (!bVar1 || retVal != 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"AUTOGEN: error: process for ");
      poVar2 = std::operator<<(poVar2,(string *)&mocFilePath);
      poVar2 = std::operator<<(poVar2," failed:\n");
      poVar2 = std::operator<<(poVar2,(string *)&output);
      std::endl<char,std::char_traits<char>>(poVar2);
      this->RunMocFailed = true;
      cmsys::SystemTools::RemoveFile(&mocFilePath);
    }
    std::__cxx11::string::~string((string *)&output);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&command);
    std::__cxx11::string::~string((string *)&msg);
    std::__cxx11::string::~string((string *)&mocDir);
    bVar1 = true;
  }
  std::__cxx11::string::~string((string *)&mocFilePath);
  return bVar1;
}

Assistant:

bool cmQtAutoGenerators::GenerateMoc(const std::string& sourceFile,
                              const std::string& mocFileName)
{
  const std::string mocFilePath = this->Builddir + mocFileName;
  int sourceNewerThanMoc = 0;
  bool success = cmsys::SystemTools::FileTimeCompare(sourceFile,
                                                     mocFilePath,
                                                     &sourceNewerThanMoc);
  if (this->GenerateAll || !success || sourceNewerThanMoc >= 0)
    {
    // make sure the directory for the resulting moc file exists
    std::string mocDir = mocFilePath.substr(0, mocFilePath.rfind('/'));
    if (!cmsys::SystemTools::FileExists(mocDir.c_str(), false))
      {
      cmsys::SystemTools::MakeDirectory(mocDir.c_str());
      }

    std::string msg = "Generating ";
    msg += mocFileName;
    cmSystemTools::MakefileColorEcho(cmsysTerminal_Color_ForegroundBlue
                                           |cmsysTerminal_Color_ForegroundBold,
                                     msg.c_str(), true, this->ColorOutput);

    std::vector<std::string> command;
    command.push_back(this->MocExecutable);
    command.insert(command.end(),
                   this->MocIncludes.begin(), this->MocIncludes.end());
    command.insert(command.end(),
                   this->MocDefinitions.begin(), this->MocDefinitions.end());
    command.insert(command.end(),
                   this->MocOptions.begin(), this->MocOptions.end());
#ifdef _WIN32
    command.push_back("-DWIN32");
#endif
    command.push_back("-o");
    command.push_back(mocFilePath);
    command.push_back(sourceFile);

    if (this->Verbose)
      {
      for(std::vector<std::string>::const_iterator cmdIt = command.begin();
          cmdIt != command.end();
          ++cmdIt)
        {
        std::cout << *cmdIt << " ";
        }
      std::cout << std::endl;
      }

    std::string output;
    int retVal = 0;
    bool result = cmSystemTools::RunSingleCommand(command, &output, &output,
                                                  &retVal);
    if (!result || retVal)
      {
      std::cerr << "AUTOGEN: error: process for " << mocFilePath <<" failed:\n"
                << output << std::endl;
      this->RunMocFailed = true;
      cmSystemTools::RemoveFile(mocFilePath);
      }
    return true;
    }
  return false;
}